

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O0

Boxed_Value
chaiscript::dispatch::detail::
dispatch_with_conversions<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>const*,std::vector<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>,std::allocator<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>>>>,std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>>>
          (__normal_iterator<const_std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_*,_std::vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>_>
           begin,__normal_iterator<const_std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_*,_std::vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>_>
                 *end,
          vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *plist,
          Type_Conversions_State *t_conversions,
          vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
          *t_funcs)

{
  bool bVar1;
  const_reference pvVar2;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *__x;
  __normal_iterator<const_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_*,_std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
  _Var3;
  pointer ppVar4;
  __normal_iterator<const_chaiscript::Type_Info_*,_std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>_>
  _Var5;
  const_iterator cVar6;
  const_iterator cVar7;
  back_insert_iterator<std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
  bVar8;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *in_RCX;
  undefined8 *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*> *in_RSI;
  element_type *in_RDI;
  Boxed_Value BVar9;
  bad_boxed_cast *anon_var_0;
  arity_error *anon_var_0_1;
  guard_error *anon_var_0_2;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *tis;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> newplist;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *next_fun_param_types;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *mat_fun_param_types;
  __normal_iterator<const_std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_*,_std::vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>_>
  matching_func;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
  *in_stack_fffffffffffffdf8;
  __normal_iterator<const_std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_*,_std::vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>_>
  *in_stack_fffffffffffffe00;
  __normal_iterator<const_chaiscript::Type_Info_*,_std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>_>
  *in_stack_fffffffffffffe08;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
  *in_stack_fffffffffffffe10;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
  *in_stack_fffffffffffffe18;
  dispatch_error *in_stack_fffffffffffffe20;
  allocator_type *in_stack_fffffffffffffe28;
  undefined1 *__n;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
  *in_stack_fffffffffffffe30;
  vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
  *this;
  __normal_iterator<const_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_*,_std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
  in_stack_fffffffffffffe38;
  __normal_iterator<const_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_*,_std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
  in_stack_fffffffffffffe40;
  Proxy_Function_Base *in_stack_fffffffffffffe48;
  element_type *t_conversions_00;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
  *in_stack_fffffffffffffe60;
  Proxy_Function_Base **in_stack_fffffffffffffe68;
  undefined1 local_100 [30];
  undefined1 local_e2;
  vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
  local_e1 [2];
  undefined1 local_9a;
  undefined1 local_99 [81];
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *local_48;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *local_40;
  __normal_iterator<const_std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_*,_std::vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>_>
  local_38 [3];
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *local_20;
  __normal_iterator<const_std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_*,_std::vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>_>
  local_10 [2];
  
  local_38[0]._M_current =
       (pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*> *)*in_RDX;
  t_conversions_00 = in_RDI;
  local_20 = in_RCX;
  local_10[0]._M_current = in_RSI;
  do {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_fffffffffffffe00,
                       (__normal_iterator<const_std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_*,_std::vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>_>
                        *)in_stack_fffffffffffffdf8);
    if (!bVar1) {
      bVar1 = __gnu_cxx::operator==
                        (in_stack_fffffffffffffe00,
                         (__normal_iterator<const_std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_*,_std::vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>_>
                          *)in_stack_fffffffffffffdf8);
      if (bVar1) {
        local_e2 = 1;
        _Var3._M_current =
             (shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)__cxa_allocate_exception(0x40)
        ;
        std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::vector
                  ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
                   in_RDI,(vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                           *)in_stack_fffffffffffffe48);
        local_e1[0].
        super__Vector_base<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
        ._M_impl.super__Vector_impl_data._9_8_ =
             std::
             vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
             ::begin((vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
                      *)in_stack_fffffffffffffdf8);
        local_e1[0].
        super__Vector_base<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
        ._M_impl.super__Vector_impl_data._1_8_ =
             std::
             vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
             ::end((vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
                    *)in_stack_fffffffffffffdf8);
        this = local_e1;
        std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>::allocator
                  ((allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_> *)
                   0x1fe2f6);
        std::
        vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>>
        ::
        vector<__gnu_cxx::__normal_iterator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>const*,std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>>>,void>
                  (this,in_stack_fffffffffffffe40,_Var3,in_stack_fffffffffffffe28);
        exception::dispatch_error::dispatch_error
                  (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                   (vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
                    *)in_stack_fffffffffffffe10);
        local_e2 = 0;
        __cxa_throw(_Var3._M_current,&exception::dispatch_error::typeinfo,
                    exception::dispatch_error::~dispatch_error);
      }
      __n = local_100;
      std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::vector
                ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
                 0x1fe3ef);
      std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::size(local_20)
      ;
      std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::reserve
                (in_stack_fffffffffffffe30,(size_type)__n);
      ppVar4 = __gnu_cxx::
               __normal_iterator<const_std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_*,_std::vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>_>
               ::operator->(local_38);
      Proxy_Function_Base::get_param_types(ppVar4->second);
      std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::begin
                ((vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)
                 in_stack_fffffffffffffdf8);
      _Var5 = __gnu_cxx::
              __normal_iterator<const_chaiscript::Type_Info_*,_std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>_>
              ::operator+(in_stack_fffffffffffffe08,(difference_type)in_stack_fffffffffffffe00);
      cVar6 = std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::end
                        ((vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)
                         in_stack_fffffffffffffdf8);
      cVar7 = std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::begin
                        (in_stack_fffffffffffffdf8);
      bVar8 = std::
              back_inserter<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>
                        (in_stack_fffffffffffffdf8);
      std::
      transform<__gnu_cxx::__normal_iterator<chaiscript::Type_Info_const*,std::vector<chaiscript::Type_Info,std::allocator<chaiscript::Type_Info>>>,__gnu_cxx::__normal_iterator<chaiscript::Boxed_Value_const*,std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>,std::back_insert_iterator<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>,chaiscript::dispatch::detail::dispatch_with_conversions<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>const*,std::vector<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>,std::allocator<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>>>>,std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>>>(__gnu_cxx::__normal_iterator<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>const*,std::vector<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>,std::allocator<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>>>>,__gnu_cxx::__normal_iterator<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>const*,std::vector<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>,std::allocator<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>>>>const&,std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>const&,chaiscript::Type_Conversions_State_const&,std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>>const&)::_lambda(chaiscript::Type_Info_const&,chaiscript::Boxed_Value_const&)_1_>
                (_Var5._M_current,cVar6._M_current,cVar7._M_current,bVar8.container);
      __gnu_cxx::
      __normal_iterator<const_std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_*,_std::vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>_>
      ::operator->(local_38);
      Proxy_Function_Base::operator()
                (in_stack_fffffffffffffe48,
                 (vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
                 in_stack_fffffffffffffe40._M_current,
                 (Type_Conversions_State *)in_stack_fffffffffffffe38._M_current);
      std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::~vector
                (in_stack_fffffffffffffe10);
      BVar9.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = extraout_RDX._M_pi;
      BVar9.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = t_conversions_00;
      return (Boxed_Value)
             BVar9.m_data.
             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
    }
    __gnu_cxx::
    __normal_iterator<const_std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_*,_std::vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>_>
    ::operator->(local_10);
    bVar1 = types_match_except_for_arithmetic<chaiscript::dispatch::Proxy_Function_Base_const*>
                      (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
                       (Type_Conversions_State *)t_conversions_00);
    if (bVar1) {
      bVar1 = __gnu_cxx::operator==
                        (in_stack_fffffffffffffe00,
                         (__normal_iterator<const_std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_*,_std::vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>_>
                          *)in_stack_fffffffffffffdf8);
      if (bVar1) {
        local_38[0]._M_current = local_10[0]._M_current;
      }
      else {
        ppVar4 = __gnu_cxx::
                 __normal_iterator<const_std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_*,_std::vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>_>
                 ::operator->(local_38);
        local_40 = Proxy_Function_Base::get_param_types(ppVar4->second);
        ppVar4 = __gnu_cxx::
                 __normal_iterator<const_std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_*,_std::vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>_>
                 ::operator->(local_10);
        local_48 = Proxy_Function_Base::get_param_types(ppVar4->second);
        std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::operator[]
                  (local_20,0);
        bVar1 = Boxed_Value::is_const((Boxed_Value *)0x1fe04c);
        if (bVar1) {
          pvVar2 = std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::
                   operator[](local_40,1);
          bVar1 = Type_Info::is_const(pvVar2);
          if (!bVar1) {
            pvVar2 = std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::
                     operator[](local_48,1);
            bVar1 = Type_Info::is_const(pvVar2);
            if (bVar1) {
              local_38[0]._M_current = local_10[0]._M_current;
              goto LAB_001fe25c;
            }
          }
        }
        std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::operator[]
                  (local_20,0);
        bVar1 = Boxed_Value::is_const((Boxed_Value *)0x1fe0be);
        if (bVar1) {
LAB_001fe105:
          local_9a = 1;
          __x = (vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
                __cxa_allocate_exception(0x40);
          std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::vector
                    ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
                     in_RDI,__x);
          local_99._9_8_ =
               std::
               vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
               ::begin((vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
                        *)in_stack_fffffffffffffdf8);
          local_99._1_8_ =
               std::
               vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
               ::end((vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
                      *)in_stack_fffffffffffffdf8);
          _Var3._M_current = (shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)local_99;
          std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>::
          allocator((allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_> *)
                    0x1fe16f);
          std::
          vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>>
          ::
          vector<__gnu_cxx::__normal_iterator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>const*,std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>>>,void>
                    ((vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
                      *)in_stack_fffffffffffffe30,_Var3,in_stack_fffffffffffffe38,
                     in_stack_fffffffffffffe28);
          exception::dispatch_error::dispatch_error
                    (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                     (vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
                      *)in_stack_fffffffffffffe10);
          local_9a = 0;
          __cxa_throw(__x,&exception::dispatch_error::typeinfo,
                      exception::dispatch_error::~dispatch_error);
        }
        pvVar2 = std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::
                 operator[](local_40,1);
        bVar1 = Type_Info::is_const(pvVar2);
        if (bVar1) goto LAB_001fe105;
        pvVar2 = std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::
                 operator[](local_48,1);
        bVar1 = Type_Info::is_const(pvVar2);
        if (!bVar1) goto LAB_001fe105;
      }
    }
LAB_001fe25c:
    __gnu_cxx::
    __normal_iterator<const_std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_*,_std::vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>_>
    ::operator++(local_10);
  } while( true );
}

Assistant:

Boxed_Value dispatch_with_conversions(InItr begin, const InItr &end, const std::vector<Boxed_Value> &plist, 
            const Type_Conversions_State &t_conversions, const Funcs &t_funcs)
        {
          InItr matching_func(end);

          while (begin != end)
          {
            if (types_match_except_for_arithmetic(begin->second, plist, t_conversions))
            {
              if (matching_func == end)
              {
                matching_func = begin;
              } else {
                // handle const members vs non-const member, which is not really ambiguous
                const auto &mat_fun_param_types = matching_func->second->get_param_types();
                const auto &next_fun_param_types = begin->second->get_param_types();

                if (plist[0].is_const() && !mat_fun_param_types[1].is_const() && next_fun_param_types[1].is_const()) {
                  matching_func = begin; // keep the new one, the const/non-const matchup is correct
                } else if (!plist[0].is_const() && !mat_fun_param_types[1].is_const() && next_fun_param_types[1].is_const()) {
                  // keep the old one, it has a better const/non-const matchup
                } else {
                  // ambiguous function call
                  throw exception::dispatch_error(plist, std::vector<Const_Proxy_Function>(t_funcs.begin(), t_funcs.end()));
                }
              }
            }

            ++begin;
          }

          if (matching_func == end)
          {
            // no appropriate function to attempt arithmetic type conversion on
            throw exception::dispatch_error(plist, std::vector<Const_Proxy_Function>(t_funcs.begin(), t_funcs.end()));
          }


          std::vector<Boxed_Value> newplist;
          newplist.reserve(plist.size());

          const std::vector<Type_Info> &tis = matching_func->second->get_param_types();
          std::transform(tis.begin() + 1, tis.end(),
                         plist.begin(),
                         std::back_inserter(newplist),
                         [](const Type_Info &ti, const Boxed_Value &param) -> Boxed_Value {
                           if (ti.is_arithmetic() && param.get_type_info().is_arithmetic()) {
                             return Boxed_Number(param).get_as(ti).bv;
                           } else {
                             return param;
                           }
                         }
                       );



          try {
            return (*(matching_func->second))(newplist, t_conversions);
          } catch (const exception::bad_boxed_cast &) {
            //parameter failed to cast
          } catch (const exception::arity_error &) {
            //invalid num params
          } catch (const exception::guard_error &) {
            //guard failed to allow the function to execute
          }

          throw exception::dispatch_error(plist, std::vector<Const_Proxy_Function>(t_funcs.begin(), t_funcs.end()));

        }